

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

MatchResultListener * __thiscall
testing::MatchResultListener::operator<<(MatchResultListener *this,char (*x) [5])

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = *(ostream **)(this + 8);
  if (poVar1 != (ostream *)0x0) {
    if (x == (char (*) [5])0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
    }
    else {
      sVar2 = strlen(*x);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,*x,sVar2);
    }
  }
  return this;
}

Assistant:

MatchResultListener& operator<<(const T& x) {
    if (stream_ != NULL)
      *stream_ << x;
    return *this;
  }